

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float128_unordered_quiet_arm(float128 a,float128 b,float_status *status)

{
  int32_t iVar1;
  int iVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  float_status *status_local;
  float128 b_local;
  float128 a_local;
  
  iVar1 = extractFloat128Exp(a);
  if (iVar1 == 0x7fff) {
    uVar3 = extractFloat128Frac0(a);
    uVar4 = extractFloat128Frac1(a);
    if (uVar3 != 0 || uVar4 != 0) goto LAB_005aae30;
  }
  iVar1 = extractFloat128Exp(b);
  if (iVar1 == 0x7fff) {
    uVar3 = extractFloat128Frac0(b);
    uVar4 = extractFloat128Frac1(b);
    if (uVar3 != 0 || uVar4 != 0) {
LAB_005aae30:
      iVar2 = float128_is_signaling_nan_arm(a,status);
      if ((iVar2 != 0) || (iVar2 = float128_is_signaling_nan_arm(b,status), iVar2 != 0)) {
        float_raise_arm('\x01',status);
      }
      return 1;
    }
  }
  return 0;
}

Assistant:

int float128_unordered_quiet(float128 a, float128 b, float_status *status)
{
    if (    (    ( extractFloat128Exp( a ) == 0x7FFF )
              && ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) )
         || (    ( extractFloat128Exp( b ) == 0x7FFF )
              && ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )
       ) {
        if (float128_is_signaling_nan(a, status)
         || float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 1;
    }
    return 0;
}